

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprIsConst(Expr *p,int initFlag,int iCur)

{
  Walker w;
  Walker WStack_38;
  
  WStack_38.eCode = (u8)initFlag;
  WStack_38.xExprCallback = exprNodeIsConstant;
  WStack_38.xSelectCallback = sqlite3SelectWalkFail;
  WStack_38.u.n = iCur;
  sqlite3WalkExpr(&WStack_38,p);
  return (int)WStack_38.eCode;
}

Assistant:

static int exprIsConst(Expr *p, int initFlag, int iCur){
  Walker w;
  w.eCode = initFlag;
  w.xExprCallback = exprNodeIsConstant;
  w.xSelectCallback = sqlite3SelectWalkFail;
#ifdef SQLITE_DEBUG
  w.xSelectCallback2 = sqlite3SelectWalkAssert2;
#endif
  w.u.iCur = iCur;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}